

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O2

void finddpos(level *lev,coord *cc,xchar xl,xchar yl,xchar xh,xchar yh)

{
  int iVar1;
  xchar y;
  xchar x;
  char cVar2;
  char cVar3;
  
  x = xl;
  if (xl != xh) {
    iVar1 = rn2(((int)xh - (int)xl) + 1);
    x = (char)iVar1 + xl;
  }
  y = yl;
  if (yl != yh) {
    iVar1 = rn2(((int)yh - (int)yl) + 1);
    y = (char)iVar1 + yl;
  }
  iVar1 = okdoor(lev,x,y);
  cVar2 = xl;
  if (iVar1 == 0) {
    for (; cVar3 = xl, y = yl, cVar2 <= xh; cVar2 = cVar2 + '\x01') {
      for (; y <= yh; y = y + '\x01') {
        iVar1 = okdoor(lev,cVar2,y);
        x = cVar2;
        if (iVar1 != 0) goto LAB_001d0cff;
      }
    }
    for (; x = xl, y = yh, cVar3 <= xh; cVar3 = cVar3 + '\x01') {
      for (y = yl; y <= yh; y = y + '\x01') {
        cVar2 = lev->locations[cVar3][y].typ;
        x = cVar3;
        if ((cVar2 == '\x0f') || (cVar2 == '\x17')) goto LAB_001d0cff;
      }
    }
  }
LAB_001d0cff:
  cc->x = x;
  cc->y = y;
  return;
}

Assistant:

static void finddpos(struct level *lev, coord *cc, xchar xl, xchar yl, xchar xh, xchar yh)
{
	xchar x, y;

	x = (xl == xh) ? xl : (xl + rn2(xh-xl+1));
	y = (yl == yh) ? yl : (yl + rn2(yh-yl+1));
	if (okdoor(lev, x, y))
		goto gotit;

	for (x = xl; x <= xh; x++) for(y = yl; y <= yh; y++)
		if (okdoor(lev, x, y))
			goto gotit;

	for (x = xl; x <= xh; x++) for(y = yl; y <= yh; y++)
		if (IS_DOOR(lev->locations[x][y].typ) || lev->locations[x][y].typ == SDOOR)
			goto gotit;
	/* cannot find something reasonable -- strange */
	x = xl;
	y = yh;
gotit:
	cc->x = x;
	cc->y = y;
	return;
}